

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O3

c_int permute_KKT(csc **KKT,qdldl_solver *p,c_int Pnz,c_int Anz,c_int m,c_int *PtoKKT,c_int *AtoKKT,
                 c_int *rhotoKKT)

{
  c_float *Info;
  longlong lVar1;
  c_int *pinv;
  c_int *AtoC;
  csc *pcVar2;
  long lVar3;
  c_int extraout_RAX;
  
  Info = (c_float *)malloc(0xa0);
  pcVar2 = *KKT;
  lVar1 = amd_l_order(pcVar2->n,pcVar2->p,pcVar2->i,p->P,(c_float *)0x0,Info);
  if (-1 < lVar1) {
    pinv = csc_pinv(p->P,(*KKT)->n);
    pcVar2 = *KKT;
    if ((PtoKKT == (c_int *)0x0 && AtoKKT == (c_int *)0x0) && rhotoKKT == (c_int *)0x0) {
      pcVar2 = csc_symperm(pcVar2,pinv,(c_int *)0x0,1);
    }
    else {
      AtoC = (c_int *)malloc(pcVar2->p[pcVar2->n] << 3);
      pcVar2 = csc_symperm(pcVar2,pinv,AtoC,1);
      if (0 < Pnz && PtoKKT != (c_int *)0x0) {
        lVar3 = 0;
        do {
          PtoKKT[lVar3] = AtoC[PtoKKT[lVar3]];
          lVar3 = lVar3 + 1;
        } while (Pnz != lVar3);
      }
      if (0 < Anz && AtoKKT != (c_int *)0x0) {
        lVar3 = 0;
        do {
          AtoKKT[lVar3] = AtoC[AtoKKT[lVar3]];
          lVar3 = lVar3 + 1;
        } while (Anz != lVar3);
      }
      if (0 < m && rhotoKKT != (c_int *)0x0) {
        lVar3 = 0;
        do {
          rhotoKKT[lVar3] = AtoC[rhotoKKT[lVar3]];
          lVar3 = lVar3 + 1;
        } while (m != lVar3);
      }
      free(AtoC);
    }
    csc_spfree(*KKT);
    *KKT = pcVar2;
    free(pinv);
  }
  free(Info);
  return extraout_RAX;
}

Assistant:

static c_int permute_KKT(csc ** KKT, qdldl_solver * p, c_int Pnz, c_int Anz, c_int m, c_int * PtoKKT, c_int * AtoKKT, c_int * rhotoKKT){
    c_float *info;
    c_int amd_status;
    c_int * Pinv;
    csc *KKT_temp;
    c_int * KtoPKPt;
    c_int i; // Indexing

    info = (c_float *)c_malloc(AMD_INFO * sizeof(c_float));

    // Compute permutation matrix P using AMD
#ifdef DLONG
    amd_status = amd_l_order((*KKT)->n, (*KKT)->p, (*KKT)->i, p->P, (c_float *)OSQP_NULL, info);
#else
    amd_status = amd_order((*KKT)->n, (*KKT)->p, (*KKT)->i, p->P, (c_float *)OSQP_NULL, info);
#endif
    if (amd_status < 0) {
        // Free Amd info and return an error
        c_free(info);
        return amd_status;
    }


    // Inverse of the permutation vector
    Pinv = csc_pinv(p->P, (*KKT)->n);

    // Permute KKT matrix
    if (!PtoKKT && !AtoKKT && !rhotoKKT){  // No vectors to be stored
        // Assign values of mapping
        KKT_temp = csc_symperm((*KKT), Pinv, OSQP_NULL, 1);
    }
    else {
        // Allocate vector of mappings from unpermuted to permuted
        KtoPKPt = c_malloc((*KKT)->p[(*KKT)->n] * sizeof(c_int));
        KKT_temp = csc_symperm((*KKT), Pinv, KtoPKPt, 1);

        // Update vectors PtoKKT, AtoKKT and rhotoKKT
        if (PtoKKT){
            for (i = 0; i < Pnz; i++){
                PtoKKT[i] = KtoPKPt[PtoKKT[i]];
            }
        }
        if (AtoKKT){
            for (i = 0; i < Anz; i++){
                AtoKKT[i] = KtoPKPt[AtoKKT[i]];
            }
        }
        if (rhotoKKT){
            for (i = 0; i < m; i++){
                rhotoKKT[i] = KtoPKPt[rhotoKKT[i]];
            }
        }

        // Cleanup vector of mapping
        c_free(KtoPKPt);
    }

    // Cleanup
    // Free previous KKT matrix and assign pointer to new one
    csc_spfree((*KKT));
    (*KKT) = KKT_temp;
    // Free Pinv
    c_free(Pinv);
    // Free Amd info
    c_free(info);

    return 0;
}